

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall chrono::ChArchiveIn::in<myEmployee>(ChArchiveIn *this,ChNameValue<myEmployee> *bVal)

{
  ChFunctorArchiveInSpecific<myEmployee> specFuncA;
  undefined **local_28;
  myEmployee *local_20;
  char *local_18;
  undefined1 *local_10;
  char local_8;
  
  local_10 = (undefined1 *)&local_28;
  local_20 = bVal->_value;
  local_28 = &PTR__ChFunctorArchiveIn_001606f8;
  local_18 = bVal->_name;
  local_8 = bVal->_flags;
  (*(this->super_ChArchive)._vptr_ChArchive[0xc])();
  return;
}

Assistant:

void in     (ChNameValue<T> bVal) {
          ChFunctorArchiveInSpecific<T> specFuncA(&bVal.value());
          this->in(ChNameValue<ChFunctorArchiveIn>(bVal.name(), specFuncA, bVal.flags()));
      }